

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidPattern * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidPattern,slang::ast::Pattern_const*&>
          (BumpAllocator *this,Pattern **args)

{
  InvalidPattern *pIVar1;
  Pattern *in_RDI;
  InvalidPattern *unaff_retaddr;
  
  pIVar1 = (InvalidPattern *)allocate((BumpAllocator *)args,(size_t)unaff_retaddr,(size_t)in_RDI);
  ast::InvalidPattern::InvalidPattern(unaff_retaddr,in_RDI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }